

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.cpp
# Opt level: O1

void wang_landau(uint blocks)

{
  Histogram<unsigned_int> histogram;
  WangLandauSampler sampler;
  FixedDegreeNetwork network;
  Random rng;
  allocator_type local_28e9;
  string local_28e8;
  string local_28c8;
  string local_28a8;
  string local_2888;
  Histogram<unsigned_int> local_2868;
  WangLandauSampler local_2838;
  Network local_27f0;
  Random local_2768;
  
  FixedDegreeNetwork::FixedDegreeNetwork((FixedDegreeNetwork *)&local_27f0,3,blocks);
  Histogram<unsigned_int>::Histogram
            (&local_2868,0,local_27f0.total_triangles / 3,local_27f0.total_triangles / 3);
  Random::Random(&local_2768,2);
  local_2838.super_UniformSampler._vptr_UniformSampler = (_func_int **)&PTR_markov_step_0010dd88;
  local_2838.super_UniformSampler.super_Sampler.rng = &local_2768;
  local_2838.super_UniformSampler.super_Sampler.histogram = &local_2868;
  local_2838.super_UniformSampler.proposer.rng = &local_2768;
  local_2838.super_UniformSampler.network = &local_27f0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2838.entropy,(ulong)(local_2868._bins + 1),&local_28e9);
  local_2838.f = 1.0;
  WangLandauSampler::sample(&local_2838,0xf,5);
  local_28c8._M_dataplus._M_p = (pointer)&local_28c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28c8,"histogram_wl_%d.dat","");
  format(&local_2888,&local_28c8,blocks);
  Histogram<unsigned_int>::export_histogram(&local_2868,&local_2888);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2888._M_dataplus._M_p != &local_2888.field_2) {
    operator_delete(local_2888._M_dataplus._M_p,local_2888.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28c8._M_dataplus._M_p != &local_28c8.field_2) {
    operator_delete(local_28c8._M_dataplus._M_p,local_28c8.field_2._M_allocated_capacity + 1);
  }
  local_28e8._M_dataplus._M_p = (pointer)&local_28e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28e8,"entropy_wl_%d.dat","");
  format(&local_28a8,&local_28e8,blocks);
  WangLandauSampler::export_entropy(&local_2838,&local_28a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28a8._M_dataplus._M_p != &local_28a8.field_2) {
    operator_delete(local_28a8._M_dataplus._M_p,local_28a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28e8._M_dataplus._M_p != &local_28e8.field_2) {
    operator_delete(local_28e8._M_dataplus._M_p,local_28e8.field_2._M_allocated_capacity + 1);
  }
  local_2838.super_UniformSampler._vptr_UniformSampler = (_func_int **)&PTR_markov_step_0010dd88;
  if (local_2838.entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2838.entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2838.entropy.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2838.entropy.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  local_2868._vptr_Histogram = (_func_int **)&PTR_v_0010dd10;
  if (local_2868._histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2868._histogram.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2868._histogram.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2868._histogram.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_27f0.triangle_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27f0.triangle_count.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_27f0.triangle_count.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_27f0.triangle_count.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_27f0.links);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_27f0.backwards_list._M_h);
  if (local_27f0.node_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27f0.node_list.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_27f0.node_list.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_27f0.node_list.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void wang_landau(unsigned int blocks) {
    FixedDegreeNetwork network(3, blocks);

    Histogram<unsigned int> histogram(0, network.get_triangles(), network.get_triangles());
    Random rng(2);

    WangLandauSampler sampler(rng, histogram, network);
    sampler.sample(15);

    histogram.export_histogram(format("histogram_wl_%d.dat", blocks));
    sampler.export_entropy(format("entropy_wl_%d.dat", blocks));
}